

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall
Assimp::ASEImporter::BuildNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes)

{
  float fVar1;
  pointer ppBVar2;
  BaseNode *pBVar3;
  BaseNode **ppBVar4;
  size_t __n;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *pvVar5;
  int iVar6;
  aiNode *paVar7;
  aiNode **ppaVar8;
  aiNode *this_00;
  pointer ppBVar9;
  aiScene *paVar10;
  runtime_error *this_01;
  uint uVar11;
  ulong uVar12;
  BaseNode **ppBVar13;
  ulong uVar14;
  long lVar15;
  BaseNode **ppBVar16;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_> aiList;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *__range1;
  aiNode *pcNode;
  vector<aiNode_*,_std::allocator<aiNode_*>_> local_b8;
  BaseNode **local_98;
  iterator iStack_90;
  BaseNode **local_88;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *local_80;
  aiNode *local_78;
  aiMatrix4x4 local_70;
  
  local_80 = nodes;
  if (this->pcScene == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/ASE/ASELoader.cpp"
                  ,0x287,"void Assimp::ASEImporter::BuildNodes(std::vector<BaseNode *> &)");
  }
  paVar7 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar7);
  this->pcScene->mRootNode = paVar7;
  (paVar7->mName).length = 9;
  builtin_strncpy((paVar7->mName).data,"<ASERoot>",10);
  this->pcScene->mRootNode->mNumChildren = 1;
  ppaVar8 = (aiNode **)operator_new__(8);
  this->pcScene->mRootNode->mChildren = ppaVar8;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pvVar5 = local_80;
  *this->pcScene->mRootNode->mChildren = this_00;
  this_00->mParent = paVar7;
  ppBVar2 = (local_80->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar9 = (local_80->
                 super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppBVar9 != ppBVar2;
      ppBVar9 = ppBVar9 + 1) {
    pBVar3 = *ppBVar9;
    fVar1 = (pBVar3->mTransform).b1;
    (pBVar3->mTransform).b1 = (pBVar3->mTransform).a2;
    (pBVar3->mTransform).a2 = fVar1;
    fVar1 = (pBVar3->mTransform).c1;
    (pBVar3->mTransform).c1 = (pBVar3->mTransform).a3;
    (pBVar3->mTransform).a3 = fVar1;
    fVar1 = (pBVar3->mTransform).c2;
    (pBVar3->mTransform).c2 = (pBVar3->mTransform).b3;
    (pBVar3->mTransform).b3 = fVar1;
    fVar1 = (pBVar3->mTransform).d1;
    (pBVar3->mTransform).d1 = (pBVar3->mTransform).a4;
    (pBVar3->mTransform).a4 = fVar1;
    fVar1 = (pBVar3->mTransform).d2;
    (pBVar3->mTransform).d2 = (pBVar3->mTransform).b4;
    (pBVar3->mTransform).b4 = fVar1;
    fVar1 = (pBVar3->mTransform).d3;
    (pBVar3->mTransform).d3 = (pBVar3->mTransform).c4;
    (pBVar3->mTransform).c4 = fVar1;
  }
  local_70.a1 = 1.0;
  local_70.a2 = 0.0;
  local_70.a3 = 0.0;
  local_70.a4 = 0.0;
  local_70.b1 = 0.0;
  local_70.b2 = 1.0;
  local_70.b3 = 0.0;
  local_70.b4 = 0.0;
  local_70.c1 = 0.0;
  local_70.c2 = 0.0;
  local_70.c3 = 1.0;
  local_70.c4 = 0.0;
  local_70.d1 = 0.0;
  local_70.d2 = 0.0;
  local_70.d3 = 0.0;
  local_70.d4 = 1.0;
  AddNodes(this,local_80,this_00,(char *)0x0,&local_70);
  local_98 = (BaseNode **)0x0;
  iStack_90._M_current = (BaseNode **)0x0;
  local_88 = (BaseNode **)0x0;
  ppBVar16 = (pvVar5->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppBVar4 = (pvVar5->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar16 != ppBVar4) {
    do {
      pBVar3 = *ppBVar16;
      if (pBVar3->mProcessed == false) {
        for (ppBVar13 = (local_80->
                        super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppBVar13 != ppBVar4;
            ppBVar13 = ppBVar13 + 1) {
          if (ppBVar13 != ppBVar16) {
            __n = ((*ppBVar13)->mName)._M_string_length;
            if ((__n == (pBVar3->mParent)._M_string_length) &&
               ((__n == 0 ||
                (iVar6 = bcmp(((*ppBVar13)->mName)._M_dataplus._M_p,
                              (pBVar3->mParent)._M_dataplus._M_p,__n), iVar6 == 0))))
            goto LAB_0039c382;
          }
        }
        if (iStack_90._M_current == local_88) {
          std::vector<Assimp::ASE::BaseNode_const*,std::allocator<Assimp::ASE::BaseNode_const*>>::
          _M_realloc_insert<Assimp::ASE::BaseNode_const*const&>
                    ((vector<Assimp::ASE::BaseNode_const*,std::allocator<Assimp::ASE::BaseNode_const*>>
                      *)&local_98,iStack_90,ppBVar16);
        }
        else {
          *iStack_90._M_current = pBVar3;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
LAB_0039c382:
      ppBVar16 = ppBVar16 + 1;
    } while (ppBVar16 != ppBVar4);
  }
  if (local_98 != iStack_90._M_current) {
    local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data
    ._M_start = (aiNode **)0x0;
    local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = (aiNode **)0x0;
    local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (aiNode **)0x0;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
              (&local_b8,
               (ulong)this->pcScene->mRootNode->mNumChildren +
               ((long)iStack_90._M_current - (long)local_98 >> 3));
    paVar7 = this->pcScene->mRootNode;
    if (paVar7->mNumChildren != 0) {
      lVar15 = 0;
      uVar14 = 0;
      do {
        ppaVar8 = (aiNode **)((long)paVar7->mChildren + lVar15);
        if (local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,ppaVar8);
        }
        else {
          *local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish = *ppaVar8;
          local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar14 = uVar14 + 1;
        paVar7 = this->pcScene->mRootNode;
        lVar15 = lVar15 + 8;
      } while (uVar14 < paVar7->mNumChildren);
    }
    if (paVar7->mChildren != (aiNode **)0x0) {
      operator_delete__(paVar7->mChildren);
    }
    ppBVar16 = local_98;
    if (local_98 != iStack_90._M_current) {
      do {
        pBVar3 = *ppBVar16;
        paVar7 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar7);
        paVar7->mParent = this->pcScene->mRootNode;
        uVar14 = (pBVar3->mName)._M_string_length;
        local_78 = paVar7;
        if (uVar14 < 0x400) {
          (paVar7->mName).length = (ai_uint32)uVar14;
          memcpy((paVar7->mName).data,(pBVar3->mName)._M_dataplus._M_p,uVar14);
          (paVar7->mName).data[uVar14] = '\0';
        }
        AddMeshes(this,pBVar3,paVar7);
        local_70.a1 = 1.0;
        local_70.a2 = 0.0;
        local_70.a3 = 0.0;
        local_70.a4 = 0.0;
        local_70.b1 = 0.0;
        local_70.b2 = 1.0;
        local_70.b3 = 0.0;
        local_70.b4 = 0.0;
        local_70.c1 = 0.0;
        local_70.c2 = 0.0;
        local_70.c3 = 1.0;
        local_70.c4 = 0.0;
        local_70.d1 = 0.0;
        local_70.d2 = 0.0;
        local_70.d3 = 0.0;
        local_70.d4 = 1.0;
        AddNodes(this,local_80,local_78,(local_78->mName).data,&local_70);
        if (local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          *local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_78;
          local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        ppBVar16 = ppBVar16 + 1;
      } while (ppBVar16 != iStack_90._M_current);
    }
    uVar14 = 0xffffffffffffffff;
    if (-1 < (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start) {
      uVar14 = (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    ppaVar8 = (aiNode **)operator_new__(uVar14);
    this->pcScene->mRootNode->mChildren = ppaVar8;
    if (local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar14 = 0;
    }
    else {
      uVar11 = 1;
      uVar12 = 0;
      do {
        this->pcScene->mRootNode->mChildren[uVar12] =
             local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
        uVar12 = (ulong)uVar11;
        uVar14 = (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        uVar11 = uVar11 + 1;
      } while (uVar12 < uVar14);
    }
    this->pcScene->mRootNode->mNumChildren = (uint)uVar14;
    if (local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (aiNode **)0x0) {
      operator_delete(local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  paVar10 = this->pcScene;
  if (paVar10->mNumMeshes != 0) {
    uVar14 = 0;
    do {
      paVar10->mMeshes[uVar14]->mColors[2] = (aiColor4D *)0x0;
      uVar14 = uVar14 + 1;
      paVar10 = this->pcScene;
    } while (uVar14 < paVar10->mNumMeshes);
  }
  paVar7 = paVar10->mRootNode;
  if (paVar7->mNumChildren == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = &local_70.b1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"ASE: No nodes loaded. The file is either empty or corrupt","");
    std::runtime_error::runtime_error(this_01,(string *)&local_70);
    *(undefined ***)this_01 = &PTR__runtime_error_007fd498;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  (paVar7->mTransformation).a1 = 1.0;
  (paVar7->mTransformation).a2 = 0.0;
  (paVar7->mTransformation).a3 = 0.0;
  (paVar7->mTransformation).a4 = 0.0;
  (paVar7->mTransformation).b1 = 0.0;
  (paVar7->mTransformation).b2 = 0.0;
  (paVar7->mTransformation).b3 = 1.0;
  (paVar7->mTransformation).b4 = 0.0;
  (paVar7->mTransformation).c1 = 0.0;
  (paVar7->mTransformation).c2 = -1.0;
  (paVar7->mTransformation).c3 = 0.0;
  (paVar7->mTransformation).c4 = 0.0;
  (paVar7->mTransformation).d1 = 0.0;
  (paVar7->mTransformation).d2 = 0.0;
  (paVar7->mTransformation).d3 = 0.0;
  (paVar7->mTransformation).d4 = 1.0;
  if (local_98 != (BaseNode **)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void ASEImporter::BuildNodes(std::vector<BaseNode*>& nodes) {
    ai_assert(NULL != pcScene);

    // allocate the one and only root node
    aiNode* root = pcScene->mRootNode = new aiNode();
    root->mName.Set("<ASERoot>");

    // Setup the coordinate system transformation
    pcScene->mRootNode->mNumChildren = 1;
    pcScene->mRootNode->mChildren = new aiNode*[1];
    aiNode* ch = pcScene->mRootNode->mChildren[0] = new aiNode();
    ch->mParent = root;

    // Change the transformation matrix of all nodes
    for (BaseNode *node : nodes) {
        aiMatrix4x4& m = node->mTransform;
        m.Transpose(); // row-order vs column-order
    }

    // add all nodes
    AddNodes(nodes,ch,NULL);

    // now iterate through al nodes and find those that have not yet
    // been added to the nodegraph (= their parent could not be recognized)
    std::vector<const BaseNode*> aiList;
    for (std::vector<BaseNode*>::iterator it = nodes.begin(), end = nodes.end();it != end; ++it)    {
        if ((*it)->mProcessed) {
            continue;
        }

        // check whether our parent is known
        bool bKnowParent = false;

        // search the list another time, starting *here* and try to find out whether
        // there is a node that references *us* as a parent
        for (std::vector<BaseNode*>::const_iterator it2 = nodes.begin();it2 != end; ++it2) {
            if (it2 == it) {
                continue;
            }

            if ((*it2)->mName == (*it)->mParent)    {
                bKnowParent = true;
                break;
            }
        }
        if (!bKnowParent)   {
            aiList.push_back(*it);
        }
    }

    // Are there ane orphaned nodes?
    if (!aiList.empty())    {
        std::vector<aiNode*> apcNodes;
        apcNodes.reserve(aiList.size() + pcScene->mRootNode->mNumChildren);

        for (unsigned int i = 0; i < pcScene->mRootNode->mNumChildren;++i)
            apcNodes.push_back(pcScene->mRootNode->mChildren[i]);

        delete[] pcScene->mRootNode->mChildren;
        for (std::vector<const BaseNode*>::/*const_*/iterator i =  aiList.begin();i != aiList.end();++i)    {
            const ASE::BaseNode* src = *i;

            // The parent is not known, so we can assume that we must add
            // this node to the root node of the whole scene
            aiNode* pcNode = new aiNode();
            pcNode->mParent = pcScene->mRootNode;
            pcNode->mName.Set(src->mName);
            AddMeshes(src,pcNode);
            AddNodes(nodes,pcNode,pcNode->mName.data);
            apcNodes.push_back(pcNode);
        }

        // Regenerate our output array
        pcScene->mRootNode->mChildren = new aiNode*[apcNodes.size()];
        for (unsigned int i = 0; i < apcNodes.size();++i)
            pcScene->mRootNode->mChildren[i] = apcNodes[i];

        pcScene->mRootNode->mNumChildren = (unsigned int)apcNodes.size();
    }

    // Reset the third color set to NULL - we used this field to store a temporary pointer
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
        pcScene->mMeshes[i]->mColors[2] = NULL;

    // The root node should not have at least one child or the file is valid
    if (!pcScene->mRootNode->mNumChildren) {
        throw DeadlyImportError("ASE: No nodes loaded. The file is either empty or corrupt");
    }

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pcScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);
}